

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O0

Player * __thiscall Gameplay::checkWinningCondition(Gameplay *this)

{
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  ostream *poVar4;
  Stronghold *this_00;
  string *psVar5;
  reference __filename;
  size_type sVar6;
  _List_iterator<Player> local_40;
  _List_node_base *local_38;
  _List_node_base *local_30;
  _Self local_28;
  _List_node_base *local_20;
  Gameplay *local_18;
  Gameplay *this_local;
  
  local_18 = this;
  local_20 = (_List_node_base *)
             std::__cxx11::list<Player,_std::allocator<Player>_>::begin(&this->players);
  (this->it)._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)std::__cxx11::list<Player,_std::allocator<Player>_>::end(&this->players)
    ;
    bVar1 = std::operator!=(&this->it,&local_28);
    if (!bVar1) break;
    pPVar3 = std::_List_iterator<Player>::operator->(&this->it);
    iVar2 = Player::getNumberOfProvinces(pPVar3);
    if (iVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Player ");
      pPVar3 = std::_List_iterator<Player>::operator->(&this->it);
      this_00 = Player::getStronghold(pPVar3);
      psVar5 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"lost.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      __filename = std::_List_iterator<Player>::operator*(&this->it);
      std::__cxx11::list<Player,_std::allocator<Player>_>::remove(&this->players,(char *)__filename)
      ;
      sVar6 = std::__cxx11::list<Player,_std::allocator<Player>_>::size(&this->players);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar6);
      poVar4 = std::operator<<(poVar4,"players remaining.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_30 = (_List_node_base *)
                 std::__cxx11::list<Player,_std::allocator<Player>_>::begin(&this->players);
      (this->it)._M_node = local_30;
    }
    local_38 = (_List_node_base *)std::_List_iterator<Player>::operator++(&this->it,0);
  }
  sVar6 = std::__cxx11::list<Player,_std::allocator<Player>_>::size(&this->players);
  if (sVar6 == 1) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<Player,_std::allocator<Player>_>::begin(&this->players);
    this_local = (Gameplay *)std::_List_iterator<Player>::operator*(&local_40);
  }
  else {
    this_local = (Gameplay *)0x0;
  }
  return (Player *)this_local;
}

Assistant:

Player *Gameplay::checkWinningCondition()                       //if someone won returns a pointer to that player else returns null
{                                                               //prints if someone lost and removes him from the list
    for (it=players.begin(); it!=players.end(); it++)
    {
        if (!it->getNumberOfProvinces())
        {
            cout << "Player "<<it->getStronghold()->getName()<<"lost." << endl;

            players.remove(*it);
            cout << players.size() <<"players remaining." << endl;

            it=players.begin();
        }
    }
    if (players.size() == 1)
        return &*players.begin();

    return nullptr;
}